

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::tab::ndf_std(tab *this,vec3 *wm)

{
  int s;
  int s_00;
  pointer pfVar1;
  float fVar2;
  float fVar3;
  float_t u;
  float_t w2;
  float_t w1;
  int j2;
  int j1;
  int i2;
  int i1;
  float local_48;
  float local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  fVar2 = 0.0;
  if (0.0 <= wm->z) {
    s = this->m_zres;
    s_00 = this->m_pres;
    if (wm->z < 1.0) {
      fVar2 = atan2f(wm->y,wm->x);
    }
    fVar3 = acosf(wm->z);
    fVar3 = fVar3 * 0.63661975;
    if (fVar3 < 0.0) {
      u = sqrtf(fVar3);
    }
    else {
      u = SQRT(fVar3);
    }
    spline::uwrap_edge(u,s,&local_34,&local_38,&local_44);
    spline::uwrap_repeat((fVar2 / 3.1415927 + 1.0) * 0.5,s_00,&local_3c,&local_40,&local_48);
    pfVar1 = (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar2 = (pfVar1[local_3c * s + local_38] - pfVar1[local_3c * s + local_34]) * local_44 +
            pfVar1[local_3c * s + local_34];
    fVar2 = (((pfVar1[s * local_40 + local_38] - pfVar1[local_34 + s * local_40]) * local_44 +
             pfVar1[local_34 + s * local_40]) - fVar2) * local_48 + fVar2;
  }
  return fVar2;
}

Assistant:

float_t tab::ndf_std(const vec3 &wm) const
{
	if (wm.z >= 0) {
		int w = m_zres;
		int h = m_pres;
		float_t pm = wm.z < 1 ? atan2(wm.y, wm.x) : 0;
		float_t u1 = sqrt(acos(wm.z) * (2 / m_pi()));
		float_t u2 = (pm / m_pi() + 1) / 2;

		return spline::eval2d(m_ndf, w, h,
		                      spline::uwrap_edge  , u1,
		                      spline::uwrap_repeat, u2);
	}
	return 0;
}